

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivial.h
# Opt level: O2

void __thiscall
trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::betti_number(trivial_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
               *this,size_t _betti,size_t _skipped)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  value_type_conflict3 local_28;
  
  local_28 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->betti,(ulong)this->current_dimension + 1,&local_28);
  local_28 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->skipped,(ulong)this->current_dimension + 1,&local_28);
  uVar1 = this->current_dimension;
  uVar3 = (ulong)((uint)uVar1 * 8);
  *(size_t *)
   ((long)(this->betti).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start + uVar3) = _betti;
  iVar2 = -(int)_betti;
  if ((uVar1 & 1) == 0) {
    iVar2 = (int)_betti;
  }
  *(size_t *)
   ((long)(this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start + uVar3) = _skipped;
  this->euler_characteristic = this->euler_characteristic + iVar2;
  return;
}

Assistant:

virtual void betti_number(size_t _betti, size_t _skipped) override {
		betti.resize(current_dimension + 1, 0);
		skipped.resize(current_dimension + 1, 0);
		betti[current_dimension] = _betti;
		skipped[current_dimension] = _skipped;
		euler_characteristic += index_t((current_dimension & 1 ? -1 : 1) * _betti);
	}